

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall
cmOrderDirectoriesConstraintSOName::~cmOrderDirectoriesConstraintSOName
          (cmOrderDirectoriesConstraintSOName *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmOrderDirectoriesConstraint)._vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraintSOName_005ca180;
  pcVar2 = (this->SOName)._M_dataplus._M_p;
  paVar1 = &(this->SOName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmOrderDirectoriesConstraint::~cmOrderDirectoriesConstraint
            (&this->super_cmOrderDirectoriesConstraint);
  operator_delete(this,0xa0);
  return;
}

Assistant:

cmOrderDirectoriesConstraintSOName(cmOrderDirectories* od,
                                     std::string const& file,
                                     const char* soname):
    cmOrderDirectoriesConstraint(od, file), SOName(soname? soname : "")
    {
    if(this->SOName.empty())
      {
      // Try to guess the soname.
      std::string soguess;
      if(cmSystemTools::GuessLibrarySOName(file, soguess))
        {
        this->SOName = soguess;
        }
      }
    }